

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EqualityProxy.cpp
# Opt level: O2

uint __thiscall Shell::EqualityProxy::getProxyPredicate(EqualityProxy *this)

{
  undefined1 *puVar1;
  Symbol *this_00;
  uint taArity;
  int iVar2;
  OperatorType *type;
  Literal *lit;
  Literal *lit_00;
  Formula *pFVar3;
  AtomicFormula *this_01;
  AtomicFormula *this_02;
  FormulaUnit *this_03;
  InferenceStore *this_04;
  initializer_list<Kernel::TermList> sorts;
  NonspecificInference0 local_62;
  Inference local_60;
  
  if (this->_addedPred == true) {
    taArity = this->_proxyPredicate;
  }
  else {
    taArity = Kernel::Signature::addFreshPredicate(DAT_00a14190,3,"sQ","eqProxy");
    this_00 = (DAT_00a14190->_preds)._stack[taArity];
    local_60._0_8_ = 1;
    local_60._8_4_ = 1;
    local_60._age = 0;
    sorts._M_len = 1;
    sorts._M_array = (iterator)0x2;
    type = Kernel::OperatorType::getPredicateType((OperatorType *)&local_60,sorts,taArity);
    Kernel::Signature::Symbol::setType(this_00,type);
    puVar1 = &this_00->field_0x40;
    *(uint *)puVar1 = *(uint *)puVar1 | 0x40040;
    if (getProxyPredicate()::args == '\0') {
      iVar2 = __cxa_guard_acquire(&getProxyPredicate()::args);
      if (iVar2 != 0) {
        getProxyPredicate::args._cursor = (TermList *)0x0;
        getProxyPredicate::args._end = (TermList *)0x0;
        getProxyPredicate::args._capacity = 0;
        getProxyPredicate::args._stack = (TermList *)0x0;
        __cxa_atexit(Lib::Stack<Kernel::TermList>::~Stack,&getProxyPredicate::args,&__dso_handle);
        __cxa_guard_release(&getProxyPredicate()::args);
      }
    }
    getProxyPredicate::args._cursor = getProxyPredicate::args._stack;
    Lib::Stack<Kernel::TermList>::push(&getProxyPredicate::args,(TermList)0x1);
    Lib::Stack<Kernel::TermList>::push(&getProxyPredicate::args,(TermList)0x5);
    Lib::Stack<Kernel::TermList>::push(&getProxyPredicate::args,(TermList)0x9);
    lit = Kernel::Literal::create(taArity,3,true,getProxyPredicate::args._stack);
    lit_00 = Kernel::Literal::createEquality(true,(TermList)0x5,(TermList)0x9,(TermList)0x1);
    pFVar3 = (Formula *)Kernel::BinaryFormula::operator_new(0x38);
    this_01 = (AtomicFormula *)Kernel::AtomicFormula::operator_new(0x30);
    Kernel::AtomicFormula::AtomicFormula(this_01,lit);
    this_02 = (AtomicFormula *)Kernel::AtomicFormula::operator_new(0x30);
    Kernel::AtomicFormula::AtomicFormula(this_02,lit_00);
    Kernel::Formula::Formula(pFVar3,IFF);
    *(AtomicFormula **)(pFVar3 + 1) = this_01;
    pFVar3[1]._label._M_dataplus._M_p = (pointer)this_02;
    pFVar3 = Kernel::Formula::quantify(pFVar3);
    this_03 = (FormulaUnit *)Kernel::FormulaUnit::operator_new(0x48);
    local_62.inputType = AXIOM;
    local_62.rule = EQUALITY_PROXY_AXIOM1;
    Kernel::Inference::Inference(&local_60,&local_62);
    Kernel::FormulaUnit::FormulaUnit(this_03,pFVar3,&local_60);
    this->_defUnit = (Unit *)this_03;
    this_04 = Kernel::InferenceStore::instance();
    Kernel::InferenceStore::recordIntroducedSymbol(this_04,this->_defUnit,PRED,taArity);
    this->_proxyPredicate = taArity;
    this->_addedPred = true;
  }
  return taArity;
}

Assistant:

unsigned EqualityProxy::getProxyPredicate()
{
  if(_addedPred){ return _proxyPredicate; }

  unsigned newPred = env.signature->addFreshPredicate(3,"sQ","eqProxy");

  TermList sort = TermList(0,false);
  TermList var1 = TermList(1,false);
  TermList var2 = TermList(2,false);

  Signature::Symbol* predSym = env.signature->getPredicate(newPred);
  OperatorType* predType = OperatorType::getPredicateType({sort, sort}, 1);
  predSym->setType(predType);
  predSym->markEqualityProxy();
  // don't need congruence axioms for the equality predicate itself
  predSym->markSkipCongruence();

  static TermStack args;
  args.reset();

  args.push(sort);
  args.push(var1);
  args.push(var2);

  Literal* proxyLit = Literal::create(newPred, 3, true, args.begin());
  Literal* eqLit = Literal::createEquality(true,var1,var2,sort);
  Formula* defForm = new BinaryFormula(IFF, new AtomicFormula(proxyLit), new AtomicFormula(eqLit));
  Formula* quantDefForm = Formula::quantify(defForm);

  _defUnit = new FormulaUnit(quantDefForm,NonspecificInference0(UnitInputType::AXIOM,InferenceRule::EQUALITY_PROXY_AXIOM1));

  InferenceStore::instance()->recordIntroducedSymbol(_defUnit, SymbolType::PRED, newPred);
  _proxyPredicate = newPred;
  _addedPred = true;
  return newPred;
}